

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16to1.h
# Opt level: O0

void ncnn::conv3x3s1_winograd63_transform_kernel_pack16to1_avx512
               (Mat *kernel,Mat *kernel_tm_packed,int inch,int outch,Option *opt)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  float *k00_1;
  int i_3;
  int q_2;
  float *g00_1;
  int k_1;
  Mat g0_1;
  Mat k0_1;
  float *k00;
  int j_1;
  int i_2;
  int q_1;
  float *g00;
  int k;
  Mat g0;
  int p;
  int i_1;
  float *tmpp;
  int j;
  int i;
  float tmp [8] [3];
  float *k2;
  float *k1;
  float *k0;
  float *kernel_tm0;
  float *kernel0;
  int q;
  int p_1;
  float ktm [8] [3];
  Mat kernel_tm;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff7d0;
  int _elempack;
  void **ppvVar2;
  size_t in_stack_fffffffffffff7d8;
  undefined8 in_stack_fffffffffffff7e0;
  int _c;
  undefined8 in_stack_fffffffffffff7e8;
  Mat *in_stack_fffffffffffff7f0;
  Allocator *in_stack_fffffffffffff850;
  int local_750;
  int local_74c;
  undefined4 *local_748;
  int local_73c;
  undefined8 local_738;
  undefined8 local_730;
  undefined8 local_728;
  undefined4 local_720;
  long local_718;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  undefined4 local_704;
  undefined4 local_700;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined4 local_6d8;
  long *local_6d0;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined4 local_690;
  long *local_688;
  undefined4 local_680;
  undefined4 local_67c;
  undefined4 local_678;
  undefined4 local_674;
  undefined4 local_670;
  undefined8 local_668;
  void *local_660;
  int local_654;
  int local_650;
  int local_64c;
  undefined4 *local_648;
  int local_63c;
  undefined8 local_638;
  undefined8 local_630;
  undefined8 local_628;
  undefined4 local_620;
  long local_618;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 local_608;
  undefined4 local_604;
  undefined4 local_600;
  undefined8 local_5f8;
  int local_5f0;
  int local_5ec;
  float *local_5e8;
  int local_5e0;
  int local_5dc;
  float local_5d8 [26];
  float *local_570;
  float *local_568;
  float *local_560;
  undefined8 local_558;
  undefined8 local_550;
  undefined8 local_548;
  undefined4 local_540;
  long *local_538;
  undefined4 local_530;
  undefined4 local_52c;
  undefined4 local_528;
  undefined4 local_524;
  undefined4 local_520;
  undefined8 local_518;
  void *local_510;
  float *local_508;
  int local_500;
  int local_4fc;
  float local_4f8 [28];
  void *local_488;
  int *local_480;
  long local_478;
  undefined4 local_470;
  long *local_468;
  undefined4 local_460;
  int local_45c;
  int local_458;
  undefined4 local_454;
  undefined4 local_450;
  long local_448;
  int local_438;
  int local_434;
  long *local_430;
  long *local_428;
  void **local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_3f8;
  undefined8 *local_3e8;
  void **local_3d8;
  int local_3b8;
  undefined4 local_3b4;
  void **local_3b0;
  undefined8 *local_390;
  undefined8 *local_370;
  undefined8 *local_350;
  undefined8 *local_340;
  undefined8 *local_330;
  undefined1 local_325;
  int local_324;
  undefined8 *local_318;
  undefined1 local_2f5;
  int local_2f4;
  void **local_2f0;
  undefined8 *local_2e8;
  undefined1 local_2c5;
  int local_2c4;
  void **local_2c0;
  undefined8 *local_2b8;
  undefined1 local_295;
  int local_294;
  undefined8 *local_288;
  undefined1 local_265;
  int local_264;
  void **local_260;
  undefined8 *local_258;
  int local_22c;
  undefined8 *local_228;
  void *local_1b8;
  int local_1a4;
  undefined8 *local_1a0;
  int local_194;
  undefined8 *local_190;
  int local_184;
  undefined8 *local_180;
  int local_174;
  undefined8 *local_170;
  long *local_168;
  undefined4 local_15c;
  long local_158;
  void *local_150;
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  long local_130;
  undefined4 local_124;
  long local_120;
  long local_118;
  undefined4 local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  long *local_f8;
  undefined4 local_ec;
  long local_e8;
  void *local_e0;
  undefined4 local_d4;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  long *local_c0;
  undefined4 local_b4;
  long local_b0;
  void *local_a8;
  undefined4 local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  long local_88;
  undefined4 local_7c;
  long local_78;
  long local_70;
  undefined4 local_64;
  int local_60;
  int local_5c;
  undefined8 *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20);
  local_420 = &local_488;
  local_488 = (void *)0x0;
  local_480 = (int *)0x0;
  local_478 = 0;
  local_470 = 0;
  local_468 = (long *)0x0;
  local_460 = 0;
  local_45c = 0;
  local_458 = 0;
  local_454 = 0;
  local_450 = 0;
  local_448 = 0;
  local_438 = in_ECX;
  local_434 = in_EDX;
  local_430 = in_RSI;
  local_428 = in_RDI;
  Mat::create(in_stack_fffffffffffff7f0,(int)((ulong)in_stack_fffffffffffff7e8 >> 0x20),
              (int)in_stack_fffffffffffff7e8,_c,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0)
  ;
  _elempack = (int)((ulong)in_stack_fffffffffffff7d0 >> 0x20);
  memcpy(local_4f8,&DAT_01f04180,0x60);
  for (local_4fc = 0; local_4fc < local_438; local_4fc = local_4fc + 1) {
    for (local_500 = 0; local_500 < local_434; local_500 = local_500 + 1) {
      local_560 = (float *)(*local_428 + (long)(local_4fc * local_434 * 9) * 4 +
                           (long)(local_500 * 9) * 4);
      local_258 = &local_558;
      local_260 = &local_488;
      local_150 = (void *)((long)local_488 + local_448 * local_4fc * local_478);
      local_138 = &local_558;
      local_8 = (long)local_45c * (long)local_458 * local_478;
      local_538 = local_468;
      local_c = 0x10;
      local_13c = local_45c;
      local_140 = local_458;
      local_144 = local_454;
      local_158 = local_478;
      local_15c = local_470;
      local_168 = local_468;
      local_264 = local_4fc;
      local_265 = 1;
      local_170 = &local_558;
      local_174 = local_500;
      local_510 = (void *)((long)local_150 + (long)local_45c * (long)local_500 * local_478);
      local_418 = &local_558;
      local_558 = 0;
      local_548 = 0;
      local_540 = 0;
      local_530 = 0;
      local_52c = 0;
      local_528 = 0;
      local_524 = 0;
      local_520 = 0;
      local_518 = 0;
      local_550 = 0;
      local_568 = local_560 + 3;
      local_570 = local_560 + 6;
      for (local_5dc = 0; local_5dc < 8; local_5dc = local_5dc + 1) {
        local_5d8[(long)local_5dc * 3] =
             *local_560 * local_4f8[(long)local_5dc * 3] +
             local_560[1] * local_4f8[(long)local_5dc * 3 + 1] +
             local_560[2] * local_4f8[(long)local_5dc * 3 + 2];
        local_5d8[(long)local_5dc * 3 + 1] =
             *local_568 * local_4f8[(long)local_5dc * 3] +
             local_560[4] * local_4f8[(long)local_5dc * 3 + 1] +
             local_560[5] * local_4f8[(long)local_5dc * 3 + 2];
        local_5d8[(long)local_5dc * 3 + 2] =
             *local_570 * local_4f8[(long)local_5dc * 3] +
             local_560[7] * local_4f8[(long)local_5dc * 3 + 1] +
             local_560[8] * local_4f8[(long)local_5dc * 3 + 2];
      }
      for (local_5e0 = 0; local_5e0 < 8; local_5e0 = local_5e0 + 1) {
        lVar1 = (long)local_5e0;
        local_5e8 = local_5d8 + lVar1 * 3;
        for (local_5ec = 0; local_5ec < 8; local_5ec = local_5ec + 1) {
          *(float *)((long)local_510 + (long)(local_5e0 * 8 + local_5ec) * 4) =
               *local_5e8 * local_4f8[(long)local_5ec * 3] +
               local_5d8[lVar1 * 3 + 1] * local_4f8[(long)local_5ec * 3 + 1] +
               local_5d8[lVar1 * 3 + 2] * local_4f8[(long)local_5ec * 3 + 2];
        }
      }
      local_508 = local_560;
      local_330 = local_418;
    }
  }
  Mat::create(in_stack_fffffffffffff7f0,(int)((ulong)in_stack_fffffffffffff7e8 >> 0x20),
              (int)in_stack_fffffffffffff7e8,_c,in_stack_fffffffffffff7d8,_elempack,
              in_stack_fffffffffffff850);
  for (local_5f0 = 0; local_5f0 + 7 < local_438; local_5f0 = local_5f0 + 8) {
    local_294 = local_5f0 / 8;
    local_288 = &local_638;
    local_104 = *(int *)((long)local_430 + 0x2c);
    local_108 = (int)local_430[6];
    local_10c = *(undefined4 *)((long)local_430 + 0x34);
    local_118 = *local_430 + local_430[8] * (long)local_294 * local_430[2];
    local_120 = local_430[2];
    local_124 = (undefined4)local_430[3];
    local_130 = local_430[4];
    local_100 = &local_638;
    local_18 = (long)local_104 * (long)local_108 * local_120;
    local_1c = 0x10;
    local_295 = 1;
    for (local_63c = 0; local_63c < 0x40; local_63c = local_63c + 1) {
      local_180 = &local_638;
      local_184 = local_63c;
      local_648 = (undefined4 *)(local_118 + (long)local_104 * (long)local_63c * local_120);
      for (local_64c = 0; local_64c + 0xf < local_434; local_64c = local_64c + 0x10) {
        for (local_650 = 0; local_650 < 0x10; local_650 = local_650 + 1) {
          for (local_654 = 0; local_654 < 8; local_654 = local_654 + 1) {
            local_2c4 = local_5f0 + local_654;
            local_2b8 = &local_6a8;
            local_2c0 = &local_488;
            local_cc = local_45c;
            local_d0 = local_458;
            local_d4 = local_454;
            local_e0 = (void *)((long)local_488 + local_448 * local_2c4 * local_478);
            local_e8 = local_478;
            local_ec = local_470;
            local_f8 = local_468;
            local_c8 = &local_6a8;
            local_688 = local_468;
            local_28 = (long)local_45c * (long)local_458 * local_478;
            local_2c = 0x10;
            local_2c5 = 1;
            local_194 = local_64c + local_650;
            local_190 = &local_6a8;
            local_660 = (void *)((long)local_e0 + (long)local_45c * (long)local_194 * local_478);
            local_410 = &local_6a8;
            local_6a8 = 0;
            local_698 = 0;
            local_690 = 0;
            local_680 = 0;
            local_67c = 0;
            local_678 = 0;
            local_674 = 0;
            local_670 = 0;
            local_668 = 0;
            local_6a0 = 0;
            *local_648 = *(undefined4 *)((long)local_660 + (long)local_63c * 4);
            local_648 = local_648 + 1;
            local_340 = local_410;
          }
        }
      }
    }
    local_408 = &local_638;
    local_638 = 0;
    local_628 = 0;
    local_620 = 0;
    local_610 = 0;
    local_60c = 0;
    local_608 = 0;
    local_604 = 0;
    local_600 = 0;
    local_5f8 = 0;
    local_630 = 0;
    local_350 = local_408;
    local_618 = local_130;
  }
  for (; local_5f0 < local_438; local_5f0 = local_5f0 + 1) {
    local_2e8 = &local_6f0;
    local_2f0 = &local_488;
    local_a8 = (void *)((long)local_488 + local_448 * local_5f0 * local_478);
    local_90 = &local_6f0;
    local_38 = (long)local_45c * (long)local_458 * local_478;
    local_324 = local_5f0 / 8 + local_5f0 % 8;
    local_318 = &local_738;
    local_5c = *(int *)((long)local_430 + 0x2c);
    local_60 = (int)local_430[6];
    local_64 = *(undefined4 *)((long)local_430 + 0x34);
    local_70 = *local_430 + local_430[8] * (long)local_324 * local_430[2];
    local_78 = local_430[2];
    local_7c = (undefined4)local_430[3];
    local_88 = local_430[4];
    local_58 = &local_738;
    local_48 = (long)local_5c * (long)local_60 * local_78;
    for (local_73c = 0; local_73c < 0x40; local_73c = local_73c + 1) {
      local_1a0 = &local_738;
      local_1a4 = local_73c;
      local_748 = (undefined4 *)(local_70 + (long)local_5c * (long)local_73c * local_78);
      for (local_74c = 0; local_74c + 0xf < local_434; local_74c = local_74c + 0x10) {
        for (local_750 = 0; local_750 < 0x10; local_750 = local_750 + 1) {
          local_22c = local_74c + local_750;
          local_228 = &local_6f0;
          *local_748 = *(undefined4 *)
                        ((long)local_a8 +
                        (long)local_73c * 4 + (long)local_45c * (long)local_22c * local_478);
          local_748 = local_748 + 1;
        }
      }
    }
    local_3f8 = &local_738;
    local_738 = 0;
    local_728 = 0;
    local_720 = 0;
    local_710 = 0;
    local_70c = 0;
    local_708 = 0;
    local_704 = 0;
    local_700 = 0;
    local_6f8 = 0;
    local_730 = 0;
    local_3e8 = &local_6f0;
    local_6d0 = local_468;
    local_3c = 0x10;
    local_4c = 0x10;
    local_94 = local_45c;
    local_98 = local_458;
    local_9c = local_454;
    local_b0 = local_478;
    local_b4 = local_470;
    local_c0 = local_468;
    local_2f4 = local_5f0;
    local_2f5 = 1;
    local_325 = 1;
    local_6f0 = 0;
    local_6e0 = 0;
    local_6d8 = 0;
    local_6c8 = 0;
    local_6c4 = 0;
    local_6c0 = 0;
    local_6bc = 0;
    local_6b8 = 0;
    local_6b0 = 0;
    local_6e8 = 0;
    local_390 = local_3e8;
    local_370 = local_3f8;
    local_718 = local_88;
  }
  ppvVar2 = &local_488;
  if (local_480 != (int *)0x0) {
    local_3b4 = 0xffffffff;
    LOCK();
    local_3b8 = *local_480;
    *local_480 = *local_480 + -1;
    UNLOCK();
    if (local_3b8 == 1) {
      local_3d8 = ppvVar2;
      local_3b0 = ppvVar2;
      if (local_468 == (long *)0x0) {
        local_1b8 = local_488;
        if (local_488 != (void *)0x0) {
          free(local_488);
        }
      }
      else {
        (**(code **)(*local_468 + 0x18))(local_468,local_488);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel_pack16to1_avx512(const Mat& kernel, Mat& kernel_tm_packed, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 64-inch-outch
    // dst = 16a-inch/16a-64-outch;
    kernel_tm_packed.create(16 * inch / 16, 64, outch / 8 + outch % 8, (size_t)4u * 8, 8);

    int p = 0;
    for (; p + 7 < outch; p += 8)
    {
        Mat g0 = kernel_tm_packed.channel(p / 8);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int q = 0; q + 15 < inch; q += 16)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel_tm.channel(p + j).row(q + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; p < outch; p++)
    {
        const Mat k0 = kernel_tm.channel(p);

        Mat g0 = kernel_tm_packed.channel(p / 8 + p % 8);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int q = 0; q + 15 < inch; q += 16)
            {
                for (int i = 0; i < 16; i++)
                {
                    const float* k00 = k0.row(q + i);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
}